

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall
Tokenizer::comparisonShiftOrAssignment
          (Tokenizer *this,char c,TokenType typeComparison,TokenType typeComparisonEq,
          TokenType typeShift,TokenType typeAssign)

{
  char cVar1;
  int iVar2;
  Mark *pMVar3;
  char in_SIL;
  Stream *in_RDI;
  Mark mark;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  Token *in_stack_fffffffffffffdc0;
  Token *pTVar4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  string *in_stack_fffffffffffffdd0;
  string *value;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  Token *in_stack_fffffffffffffde0;
  undefined1 local_1f9 [96];
  undefined1 local_199 [33];
  string local_178 [95];
  undefined1 local_119 [112];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [92];
  Mark local_2c;
  char local_11;
  bool local_1;
  
  local_11 = in_SIL;
  pMVar3 = Stream::getMark(in_RDI);
  local_2c = *pMVar3;
  cVar1 = Stream::peek((Stream *)0x1956be);
  if (cVar1 == local_11) {
    iVar2 = Stream::advance((Stream *)in_stack_fffffffffffffdc0);
    if (iVar2 == local_11) {
      iVar2 = Stream::advance((Stream *)in_stack_fffffffffffffdc0);
      if (iVar2 == 0x3d) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0,
                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38),
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (char *)in_stack_fffffffffffffdc0);
        Token::Token(in_stack_fffffffffffffde0,
                     (TokenType *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     in_stack_fffffffffffffdd0,
                     (Mark *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        Token::operator=(in_stack_fffffffffffffdc0,
                         (Token *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        Token::~Token((Token *)0x1957a1);
        std::__cxx11::string::~string(local_88);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator(&local_a9);
        Stream::advance((Stream *)in_stack_fffffffffffffdc0);
      }
      else {
        iVar2 = (int)local_11;
        pTVar4 = (Token *)local_119;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pTVar4,
                   CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                   (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38),
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
        ;
        Token::Token(pTVar4,(TokenType *)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                     in_stack_fffffffffffffdd0,
                     (Mark *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        Token::operator=(in_stack_fffffffffffffdc0,
                         (Token *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        Token::~Token((Token *)0x1958c8);
        std::__cxx11::string::~string((string *)(local_119 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_119);
      }
    }
    else {
      cVar1 = Stream::peek((Stream *)0x19593c);
      if (cVar1 == '=') {
        iVar2 = (int)local_11;
        value = (string *)local_199;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0,
                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (char)((ulong)value >> 0x38),
                   (allocator<char> *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar2,in_stack_fffffffffffffdc8),(char *)in_stack_fffffffffffffdc0);
        Token::Token(in_stack_fffffffffffffde0,
                     (TokenType *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     value,(Mark *)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
        Token::operator=(in_stack_fffffffffffffdc0,
                         (Token *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        Token::~Token((Token *)0x1959eb);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string((string *)(local_199 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_199);
        Stream::advance((Stream *)in_stack_fffffffffffffdc0);
      }
      else {
        iVar2 = (int)local_11;
        pTVar4 = (Token *)local_1f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0,
                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (char)((ulong)in_stack_fffffffffffffdd0 >> 0x38),
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
        ;
        Token::Token(in_stack_fffffffffffffde0,
                     (TokenType *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     in_stack_fffffffffffffdd0,
                     (Mark *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        Token::operator=(pTVar4,(Token *)CONCAT44(iVar2,in_stack_fffffffffffffdb8));
        Token::~Token((Token *)0x195b00);
        std::__cxx11::string::~string((string *)(local_1f9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1f9);
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tokenizer::comparisonShiftOrAssignment(char c, TokenType typeComparison, 
    TokenType typeComparisonEq, TokenType typeShift, TokenType typeAssign)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == c)
    {
      if(stream_.advance() == '=')
      {
        token_ = Token{typeAssign, std::string(2, c) + "=", mark};
        stream_.advance();
      }
      else
        token_ = Token{typeShift, std::string(2, c), mark};
    }
    else if(stream_.peek() == '=')
    {
      token_ = Token{typeComparisonEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else
      token_ = Token{typeComparison, std::string(1, c), mark};
  }
  else
    return false;

  return true;
}